

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quirrel_parser.cpp
# Opt level: O1

Node * __thiscall
Parser::createCallNode
          (Parser *this,Token *t,Node *function,vector<Node_*,_std::allocator<Node_*>_> *params)

{
  pointer *pppNVar1;
  iterator __position;
  Node *this_00;
  pointer ppNVar2;
  long lVar3;
  ulong uVar4;
  Node *local_30;
  
  if (function == (Node *)0x0) {
    this_00 = (Node *)0x0;
  }
  else {
    local_30 = function;
    this_00 = (Node *)operator_new(0x30);
    CompilationContext::Poolable::Poolable((Poolable *)this_00,this->ctx);
    this_00->tok = t;
    (this_00->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (this_00->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (this_00->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    this_00->nodeType = PNT_FUNCTION_CALL;
    ppNVar2 = (this_00->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (ppNVar2 == (pointer)0x0) {
      std::vector<Node*,std::allocator<Node*>>::_M_realloc_insert<Node*const&>
                ((vector<Node*,std::allocator<Node*>> *)&this_00->children,(iterator)0x0,&local_30);
    }
    else {
      *ppNVar2 = local_30;
      pppNVar1 = &(this_00->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      *pppNVar1 = *pppNVar1 + 1;
    }
    ppNVar2 = (params->super__Vector_base<Node_*,_std::allocator<Node_*>_>)._M_impl.
              super__Vector_impl_data._M_start;
    if ((params->super__Vector_base<Node_*,_std::allocator<Node_*>_>)._M_impl.
        super__Vector_impl_data._M_finish != ppNVar2) {
      lVar3 = 0;
      uVar4 = 0;
      do {
        __position._M_current =
             (this_00->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this_00->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<Node*,std::allocator<Node*>>::_M_realloc_insert<Node*const&>
                    ((vector<Node*,std::allocator<Node*>> *)&this_00->children,__position,
                     (Node **)((long)ppNVar2 + lVar3));
        }
        else {
          *__position._M_current = *(Node **)((long)ppNVar2 + lVar3);
          pppNVar1 = &(this_00->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
          *pppNVar1 = *pppNVar1 + 1;
        }
        uVar4 = uVar4 + 1;
        ppNVar2 = (params->super__Vector_base<Node_*,_std::allocator<Node_*>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        lVar3 = lVar3 + 8;
      } while (uVar4 < (ulong)((long)(params->super__Vector_base<Node_*,_std::allocator<Node_*>_>).
                                     _M_impl.super__Vector_impl_data._M_finish - (long)ppNVar2 >> 3)
              );
    }
  }
  return this_00;
}

Assistant:

Node * createCallNode(Token & t, Node * function, vector<Node *> & params)
  {
    if (!function)
      return nullptr;

    Node * n = new Node(ctx, t);
    n->nodeType = PNT_FUNCTION_CALL;
    n->children.push_back(function);
    for (size_t i = 0; i < params.size(); i++)
      n->children.push_back(params[i]);
    return n;
  }